

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

transformations_t *
opengv::absolute_pose::gp3p
          (transformations_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,
          vector<int,_std::allocator<int>_> *indices)

{
  transformations_t *ptVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  size_t i;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  double *local_1d8;
  undefined1 local_1d0 [24];
  variable_if_dynamic<long,__1> local_1b8;
  variable_if_dynamic<long,__1> local_1b0;
  variable_if_dynamic<long,__1> local_1a8;
  Index local_1a0;
  transformations_t *local_198;
  vector<int,_std::allocator<int>_> *local_190;
  double *local_188;
  Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> local_180;
  rotation_t R;
  Matrix3d p;
  Matrix3d v;
  Matrix3d f;
  
  local_1d8 = (double *)&v;
  pdVar4 = (double *)&p;
  pdVar5 = (double *)&f;
  local_198 = __return_storage_ptr__;
  local_190 = indices;
  for (dVar3 = 0.0; pvVar2 = local_190, ptVar1 = local_198, dVar3 != 1.48219693752374e-323;
      dVar3 = (double)((long)dVar3 + 1)) {
    local_188 = pdVar4;
    (*adapter->_vptr_AbsoluteAdapterBase[2])
              (local_1d0,adapter,
               (long)(local_190->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[(long)dVar3]);
    R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
         1.48219693752374e-323;
    R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         (double)pdVar5;
    R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         (double)&f;
    R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = dVar3
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&R,
               (Matrix<double,_3,_1,_0,_3,_1> *)local_1d0);
    (*adapter->_vptr_AbsoluteAdapterBase[5])
              (&R,adapter,
               (long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[(long)dVar3]);
    local_1b0.m_value = 0;
    local_1a0 = 3;
    local_180.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startRow.m_value
         = 0;
    local_180.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_outerStride = 3;
    local_1d0._0_8_ = &R;
    local_1d0._8_8_ = pdVar5;
    local_1b8.m_value = (long)&f;
    local_1a8.m_value = (long)dVar3;
    local_180.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data = pdVar5
    ;
    local_180.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_xpr = &f;
    local_180.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startCol.m_value
         = (long)dVar3;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,0>>
              (&local_180,
               (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>
                *)local_1d0);
    (*adapter->_vptr_AbsoluteAdapterBase[4])
              (&local_180,adapter,
               (long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[(long)dVar3]);
    local_1d0._16_8_ = &v;
    local_1d0._0_8_ = local_1d8;
    local_1b8.m_value = 0;
    local_1a8.m_value = 3;
    local_1b0.m_value = (long)dVar3;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_1d0,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_180);
    pdVar4 = local_188;
    (*adapter->_vptr_AbsoluteAdapterBase[6])
              (&local_180,adapter,
               (long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[(long)dVar3]);
    local_1d0._16_8_ = &p;
    local_1d0._0_8_ = pdVar4;
    local_1b8.m_value = 0;
    local_1a8.m_value = 3;
    local_1b0.m_value = (long)dVar3;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_1d0,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_180);
    local_1d8 = local_1d8 + 3;
    pdVar4 = pdVar4 + 3;
    pdVar5 = pdVar5 + 3;
  }
  (local_198->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_198->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_198->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  modules::gp3p_main(&f,&v,&p,local_198);
  return ptVar1;
}

Assistant:

opengv::transformations_t
opengv::absolute_pose::gp3p(
    const AbsoluteAdapterBase & adapter,
    const std::vector<int> & indices )
{
  assert(indices.size()>2);

  Eigen::Matrix3d f;
  Eigen::Matrix3d v;
  Eigen::Matrix3d p;

  for(size_t i = 0; i < 3; i++)
  {
    f.col(i) = adapter.getBearingVector(indices[i]);
    rotation_t R = adapter.getCamRotation(indices[i]);
    
    //unrotate the bearingVectors already so the camera rotation doesn't appear
    //in the problem
    f.col(i) = R * f.col(i);
    v.col(i) = adapter.getCamOffset(indices[i]);
    p.col(i) = adapter.getPoint(indices[i]);
  }

  transformations_t solutions;
  modules::gp3p_main(f,v,p,solutions);

  return solutions;
}